

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaExist.c
# Opt level: O1

Gia_Man_t *
Gia_ManQuantExist2Dup
          (Gia_Man_t *p,int iLit,Vec_Int_t *vCis,Vec_Int_t *vSide,Vec_Int_t *vAnds,int *pOutLit)

{
  ulong uVar1;
  Gia_Obj_t *pGVar2;
  int *piVar3;
  int *piVar4;
  int iVar5;
  Gia_Man_t *p_00;
  Gia_Obj_t *pGVar6;
  uint uVar7;
  int Fill;
  long lVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  int iVar12;
  
  p_00 = Gia_ManStart(vCis->nSize + vSide->nSize + vAnds->nSize * 10);
  Gia_ManQuantSetSuppStart(p_00);
  Gia_ManHashStart(p_00);
  if ((p->vCopies).nSize < p->nObjs) {
    Vec_IntFillExtra(&p->vCopies,p->nObjs,Fill);
  }
  if (0 < vSide->nSize) {
    lVar8 = 0;
    do {
      uVar7 = vSide->pArray[lVar8];
      pGVar6 = Gia_ManAppendObj(p_00);
      uVar1 = *(ulong *)pGVar6;
      *(ulong *)pGVar6 = uVar1 | 0x9fffffff;
      *(ulong *)pGVar6 =
           uVar1 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20
      ;
      pGVar2 = p_00->pObjs;
      if ((pGVar6 < pGVar2) || (pGVar2 + p_00->nObjs <= pGVar6)) goto LAB_00206a24;
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar6 - (long)pGVar2) >> 2) * -0x55555555);
      pGVar2 = p_00->pObjs;
      if ((pGVar6 < pGVar2) || (pGVar2 + p_00->nObjs <= pGVar6)) goto LAB_00206a24;
      if (((int)uVar7 < 0) || ((p->vCopies).nSize <= (int)uVar7)) goto LAB_00206a05;
      (p->vCopies).pArray[uVar7] = (int)((ulong)((long)pGVar6 - (long)pGVar2) >> 2) * 0x55555556;
      Gia_ManQuantSetSuppZero(p_00);
      lVar8 = lVar8 + 1;
    } while (lVar8 < vSide->nSize);
  }
  if (0 < vCis->nSize) {
    lVar8 = 0;
    do {
      uVar7 = vCis->pArray[lVar8];
      pGVar6 = Gia_ManAppendObj(p_00);
      uVar1 = *(ulong *)pGVar6;
      *(ulong *)pGVar6 = uVar1 | 0x9fffffff;
      *(ulong *)pGVar6 =
           uVar1 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20
      ;
      pGVar2 = p_00->pObjs;
      if ((pGVar6 < pGVar2) || (pGVar2 + p_00->nObjs <= pGVar6)) {
LAB_00206a24:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar6 - (long)pGVar2) >> 2) * -0x55555555);
      pGVar2 = p_00->pObjs;
      if ((pGVar6 < pGVar2) || (pGVar2 + p_00->nObjs <= pGVar6)) goto LAB_00206a24;
      if (((int)uVar7 < 0) || ((p->vCopies).nSize <= (int)uVar7)) goto LAB_00206a05;
      iVar12 = (int)((long)pGVar6 - (long)pGVar2 >> 2);
      uVar9 = iVar12 * -0x55555555;
      iVar12 = iVar12 * 0x55555556;
      (p->vCopies).pArray[uVar7] = iVar12;
      Gia_ManQuantSetSuppZero(p_00);
      if (iVar12 < 0) goto LAB_00206aa0;
      if (p_00->nObjs <= (int)(uVar9 & 0x7fffffff)) goto LAB_00206a62;
      Gia_ManQuantSetSuppCi(p_00,p_00->pObjs + (uVar9 & 0x7fffffff));
      lVar8 = lVar8 + 1;
    } while (lVar8 < vCis->nSize);
  }
  if (0 < vAnds->nSize) {
    lVar8 = 0;
    do {
      iVar12 = vAnds->pArray[lVar8];
      lVar10 = (long)iVar12;
      if ((lVar10 < 0) || (p->nObjs <= iVar12)) {
LAB_00206a62:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      uVar1 = *(ulong *)(p->pObjs + lVar10);
      uVar7 = iVar12 - ((uint)uVar1 & 0x1fffffff);
      if (((((int)uVar7 < 0) || (iVar5 = (p->vCopies).nSize, iVar5 <= (int)uVar7)) ||
          (uVar11 = (uint)(uVar1 >> 0x20), uVar9 = iVar12 - (uVar11 & 0x1fffffff), (int)uVar9 < 0))
         || (iVar5 <= (int)uVar9)) goto LAB_00206a43;
      piVar3 = (p->vCopies).pArray;
      uVar7 = piVar3[uVar7];
      if (((int)uVar7 < 0) || (uVar9 = piVar3[uVar9], (int)uVar9 < 0)) goto LAB_00206a81;
      iVar5 = Gia_ManHashAnd(p_00,uVar7 ^ (uint)(uVar1 >> 0x1d) & 1,uVar9 ^ uVar11 >> 0x1d & 1);
      if ((p->vCopies).nSize <= iVar12) goto LAB_00206a05;
      (p->vCopies).pArray[lVar10] = iVar5;
      lVar8 = lVar8 + 1;
    } while (lVar8 < vAnds->nSize);
  }
  if (iLit < 0) {
LAB_00206aa0:
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                  ,0x12f,"int Abc_Lit2Var(int)");
  }
  if ((p->vCopies).nSize <= (int)((uint)iLit >> 1)) {
LAB_00206a43:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  piVar3 = (p->vCopies).pArray;
  if (piVar3[(uint)iLit >> 1] < 0) {
LAB_00206a81:
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                  ,0x132,"int Abc_LitNotCond(int, int)");
  }
  if (pOutLit != (int *)0x0) {
    *pOutLit = piVar3[(uint)iLit >> 1] ^ iLit & 1U;
  }
  if (0 < vSide->nSize) {
    piVar4 = vSide->pArray;
    lVar8 = 0;
    do {
      iVar12 = piVar4[lVar8];
      if (((long)iVar12 < 0) || ((p->vCopies).nSize <= iVar12)) goto LAB_00206a05;
      piVar3[iVar12] = -1;
      lVar8 = lVar8 + 1;
    } while (lVar8 < vSide->nSize);
  }
  if (0 < vCis->nSize) {
    piVar4 = vCis->pArray;
    lVar8 = 0;
    do {
      iVar12 = piVar4[lVar8];
      if (((long)iVar12 < 0) || ((p->vCopies).nSize <= iVar12)) goto LAB_00206a05;
      piVar3[iVar12] = -1;
      lVar8 = lVar8 + 1;
    } while (lVar8 < vCis->nSize);
  }
  if (0 < vAnds->nSize) {
    piVar4 = vAnds->pArray;
    lVar8 = 0;
    do {
      iVar12 = piVar4[lVar8];
      if (((long)iVar12 < 0) || ((p->vCopies).nSize <= iVar12)) {
LAB_00206a05:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      piVar3[iVar12] = -1;
      lVar8 = lVar8 + 1;
    } while (lVar8 < vAnds->nSize);
  }
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManQuantExist2Dup( Gia_Man_t * p, int iLit, Vec_Int_t * vCis, Vec_Int_t * vSide, Vec_Int_t * vAnds, int * pOutLit )
{
    int i, iObj, iLit0, iLit1, iLitR;
    Gia_Man_t * pNew = Gia_ManStart( Vec_IntSize(vSide) + Vec_IntSize(vCis) + 10*Vec_IntSize(vAnds) );
    Gia_ManQuantSetSuppStart( pNew );
    Gia_ManHashStart( pNew ); 
    if ( Vec_IntSize(&p->vCopies) < Gia_ManObjNum(p) )
        Vec_IntFillExtra( &p->vCopies, Gia_ManObjNum(p), -1 );
    Vec_IntForEachEntry( vSide, iObj, i )
    {
        Gia_ObjSetCopyArray( p, iObj, Gia_ManAppendCi(pNew) );
        Gia_ManQuantSetSuppZero( pNew );
    }
    Vec_IntForEachEntry( vCis,  iObj, i )
    {
        Gia_ObjSetCopyArray( p, iObj, (iLit0 = Gia_ManAppendCi(pNew)) );
        Gia_ManQuantSetSuppZero( pNew );
        Gia_ManQuantSetSuppCi( pNew, Gia_ManObj(pNew, Abc_Lit2Var(iLit0)) );
    }
    Vec_IntForEachEntry( vAnds, iObj, i )
    {
        Gia_Obj_t * pObj = Gia_ManObj( p, iObj );
        iLit0 = Gia_ObjCopyArray( p, Gia_ObjFaninId0(pObj, iObj) );
        iLit1 = Gia_ObjCopyArray( p, Gia_ObjFaninId1(pObj, iObj) );
        iLit0 = Abc_LitNotCond( iLit0, Gia_ObjFaninC0(pObj) );
        iLit1 = Abc_LitNotCond( iLit1, Gia_ObjFaninC1(pObj) );
        iLitR = Gia_ManHashAnd( pNew, iLit0, iLit1 );
        Gia_ObjSetCopyArray( p, iObj, iLitR );
    }
    iLit0 = Gia_ObjCopyArray( p, Abc_Lit2Var(iLit) );
    iLit0 = Abc_LitNotCond( iLit0, Abc_LitIsCompl(iLit) );
    if ( pOutLit ) *pOutLit = iLit0;
    Vec_IntForEachEntry( vSide, iObj, i )
        Gia_ObjSetCopyArray( p, iObj, -1 );
    Vec_IntForEachEntry( vCis,  iObj, i )
        Gia_ObjSetCopyArray( p, iObj, -1 );
    Vec_IntForEachEntry( vAnds, iObj, i )
        Gia_ObjSetCopyArray( p, iObj, -1 );
    return pNew;
}